

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  TString *pTVar1;
  ravi_type_map rVar2;
  LocVar *pLVar3;
  ulong uVar4;
  Upvaldesc *pUVar5;
  uint uVar6;
  uint uVar7;
  Upvaldesc *pUVar8;
  BlockCnt *pBVar9;
  TString *usertype;
  TString *local_38;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VVOID;
    (var->u).info = 0;
    var->ravi_type_map = 0xffffffff;
    var->usertype = (TString *)0x0;
    var->pc = -1;
    (var->u).ind.usertype = (TString *)0x0;
    return;
  }
  uVar7 = (uint)fs->nactvar;
  while (uVar6 = uVar7, 0 < (int)uVar6) {
    uVar7 = uVar6 - 1;
    pLVar3 = getlocvar(fs,uVar7);
    if (pLVar3->varname == n) {
      local_38 = (TString *)0x0;
      rVar2 = raviY_get_register_typeinfo(fs,uVar7,&local_38);
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).info = uVar7;
      var->ravi_type_map = rVar2;
      var->usertype = local_38;
      var->pc = -1;
      (var->u).ind.usertype = (TString *)0x0;
      if (base != 0) {
        return;
      }
      pBVar9 = (BlockCnt *)&fs->bl;
      do {
        pBVar9 = pBVar9->previous;
      } while ((int)uVar6 <= (int)(uint)pBVar9->nactvar);
      pBVar9->upval = '\x01';
      return;
    }
  }
  if ((ulong)fs->nups != 0) {
    pUVar5 = fs->f->upvalues;
    uVar4 = 0;
    pUVar8 = pUVar5;
    do {
      if (pUVar8->name == n) goto LAB_001231cf;
      uVar4 = uVar4 + 1;
      pUVar8 = pUVar8 + 1;
    } while (fs->nups != uVar4);
  }
  singlevaraux(fs->prev,n,var,0);
  if (var->k != VVOID) {
    uVar7 = newupvalue(fs,n,var);
    uVar4 = (ulong)uVar7;
    pUVar5 = fs->f->upvalues;
LAB_001231cf:
    rVar2 = pUVar5[uVar4 & 0xffffffff].ravi_type_map;
    pTVar1 = pUVar5[uVar4 & 0xffffffff].usertype;
    var->t = -1;
    var->f = -1;
    var->k = VUPVAL;
    (var->u).info = (int)uVar4;
    var->ravi_type_map = rVar2;
    var->usertype = pTVar1;
    var->pc = -1;
    (var->u).ind.usertype = (TString *)0x0;
  }
  return;
}

Assistant:

static void singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    init_exp(var, VVOID, 0, RAVI_TM_ANY, NULL);  /* default is global */
  else {
    int v = searchvar(fs, n);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      /* RAVI set type of local var / expr if possible */
      TString *usertype = NULL;
      ravi_type_map tt = raviY_get_register_typeinfo(fs, v, &usertype);
      init_exp(var, VLOCAL, v, tt, usertype);  /* variable is local, RAVI set type */
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
        if (var->k == VVOID)  /* not found? */
          return;  /* it is a global */
        /* else was LOCAL or UPVAL */
        idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
      }
      init_exp(var, VUPVAL, idx, fs->f->upvalues[idx].ravi_type_map, fs->f->upvalues[idx].usertype); /* RAVI : set upvalue type */
    }
  }
}